

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FMultiBlockLinesIterator::startIteratorForGroup(FMultiBlockLinesIterator *this,int group)

{
  double dVar1;
  subsector_t *psVar2;
  sector_t_conflict *psVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 0.0;
  dVar6 = 0.0;
  if (this->basegroup != group) {
    iVar4 = Displacements.size * group + (int)this->basegroup;
    dVar5 = Displacements.data.Array[iVar4].pos.X;
    dVar6 = Displacements.data.Array[iVar4].pos.Y;
  }
  dVar5 = dVar5 + (this->checkpoint).X;
  (this->offset).X = dVar5;
  (this->offset).Y = dVar6 + (this->checkpoint).Y;
  psVar3 = (sector_t_conflict *)this->startsector;
  if (psVar3->PortalGroup != group) {
    psVar2 = P_PointInSubsector(dVar5,(this->offset).Y);
    psVar3 = psVar2->sector;
  }
  this->cursector = (sector_t *)psVar3;
  dVar5 = (this->checkpoint).Z;
  dVar6 = (this->offset).X;
  dVar1 = (this->offset).Y;
  (this->bbox).m_Box[0] = dVar1 + dVar5;
  (this->bbox).m_Box[2] = dVar6 - dVar5;
  (this->bbox).m_Box[3] = dVar6 + dVar5;
  (this->bbox).m_Box[1] = dVar1 - dVar5;
  FBlockLinesIterator::init(&this->blockIterator,(EVP_PKEY_CTX *)&this->bbox);
  return;
}

Assistant:

void FMultiBlockLinesIterator::startIteratorForGroup(int group)
{
	offset = Displacements.getOffset(basegroup, group);
	offset.X += checkpoint.X;
	offset.Y += checkpoint.Y;
	cursector = group == startsector->PortalGroup ? startsector : P_PointInSector(offset);
	bbox.setBox(offset.X, offset.Y, checkpoint.Z);
	blockIterator.init(bbox);
}